

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

FILE * stb_fopen(char *filename,char *mode)

{
  stb_ptrmap *a;
  long lVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  FILE *pFVar7;
  undefined8 *v;
  ulong uVar8;
  char name_full [4096];
  char temp_full [4108];
  
  if ((*mode != 'w') && (pcVar4 = strchr(mode,0x2b), pcVar4 == (char *)0x0)) {
    pFVar7 = fopen(filename,mode);
    return (FILE *)pFVar7;
  }
  name_full[0] = '\0';
  iVar2 = stb_fullpath(name_full,0x1000,filename);
  if (iVar2 != 0) {
    sVar5 = strlen(name_full);
    uVar8 = sVar5 & 0xffffffff;
    lVar1 = sVar5 << 0x20;
    while( true ) {
      lVar6 = lVar1;
      uVar8 = uVar8 - 1;
      if ((int)(uint)uVar8 < 1) break;
      uVar3 = (byte)name_full[(uint)uVar8 & 0x7fffffff] - 0x2f;
      if (((uVar3 < 0x2e) && ((0x200000000801U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) ||
         (lVar1 = lVar6 + -0x100000000, name_full[(uint)uVar8 & 0x7fffffff] == 0x7e)) break;
    }
    sVar5 = lVar6 >> 0x20;
    memcpy(temp_full,name_full,sVar5);
    builtin_strncpy(temp_full + sVar5,"stmpXXXXXX",0xb);
    iVar2 = mkstemp(temp_full);
    if (iVar2 != -1) {
      pFVar7 = fdopen(iVar2,mode);
      if (pFVar7 != (FILE *)0x0) {
        v = (undefined8 *)malloc(0x18);
        if (v != (undefined8 *)0x0) {
          if (stb__files == (stb_ptrmap *)0x0) {
            stb__files = stb_ptrmap_create();
          }
          a = stb__files;
          pcVar4 = strdup(temp_full);
          *v = pcVar4;
          pcVar4 = strdup(name_full);
          v[1] = pcVar4;
          *(undefined4 *)(v + 2) = 0;
          stb_ptrmap_add(a,pFVar7,v);
          return (FILE *)pFVar7;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x1579,"FILE *stb_fopen(char *, char *)");
      }
      unlink(temp_full);
      close(iVar2);
    }
  }
  return (FILE *)0x0;
}

Assistant:

FILE *  stb_fopen(char *filename, char *mode)
{
   FILE *f;
   char name_full[4096];
   char temp_full[sizeof(name_full) + 12];
   int p;
#ifdef _MSC_VER
   int j;
#endif
   if (mode[0] != 'w' && !strchr(mode, '+'))
      return stb__fopen(filename, mode);

   // save away the full path to the file so if the program
   // changes the cwd everything still works right! unix has
   // better ways to do this, but we have to work in windows
   name_full[0] = '\0'; // stb_fullpath reads name_full[0]
   if (stb_fullpath(name_full, sizeof(name_full), filename)==0)
      return 0;

   // try to generate a temporary file in the same directory
   p = strlen(name_full)-1;
   while (p > 0 && name_full[p] != '/' && name_full[p] != '\\'
                && name_full[p] != ':' && name_full[p] != '~')
      --p;
   ++p;

   memcpy(temp_full, name_full, p);

   #ifdef _MSC_VER
   // try multiple times to make a temp file... just in
   // case some other process makes the name first
   for (j=0; j < 32; ++j) {
      strcpy(temp_full+p, "stmpXXXXXX");
      if (stb_mktemp(temp_full) == NULL)
         return 0;

      f = fopen(temp_full, mode);
      if (f != NULL)
         break;
   }
   #else
   {
      strcpy(temp_full+p, "stmpXXXXXX");
      #ifdef __MINGW32__
         int fd = open(mktemp(temp_full), O_RDWR);
      #else
         int fd = mkstemp(temp_full);
      #endif
      if (fd == -1) return NULL;
      f = fdopen(fd, mode);
      if (f == NULL) {
         unlink(temp_full);
         close(fd);
         return NULL;
      }
   }
   #endif
   if (f != NULL) {
      stb__file_data *d = (stb__file_data *) malloc(sizeof(*d));
      if (!d) { assert(0);  /* NOTREACHED */fclose(f); return NULL; }
      if (stb__files == NULL) stb__files = stb_ptrmap_create();
      d->temp_name = strdup(temp_full);
      d->name      = strdup(name_full);
      d->errors    = 0;
      stb_ptrmap_add(stb__files, f, d);
      return f;
   }

   return NULL;
}